

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QString>::resolve<QString>(PromiseData<QString> *this,QString *value)

{
  PromiseValue<QString> local_28;
  QString *local_18;
  QString *value_local;
  PromiseData<QString> *this_local;
  
  local_18 = value;
  value_local = (QString *)this;
  PromiseValue<QString>::PromiseValue(&local_28,value);
  PromiseValue<QString>::operator=(&this->m_value,&local_28);
  PromiseValue<QString>::~PromiseValue(&local_28);
  PromiseDataBase<QString,_void_(const_QString_&)>::setSettled
            (&this->super_PromiseDataBase<QString,_void_(const_QString_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }